

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::attachmentQueryEmptyFboTest(TestContext *testCtx,Context *ctx)

{
  undefined4 local_20;
  int local_1c;
  GLint unused;
  int ndx;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  _unused = ctx;
  ctx_local = (Context *)testCtx;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    checkFboAttachmentParam
              ((TestContext *)ctx_local,_unused,
               attachmentQueryEmptyFboTest::attachmentPoints[local_1c],0x8cd0,0);
  }
  checkFboAttachmentParam((TestContext *)ctx_local,_unused,0x8ce0,0x8cd1,0);
  local_20 = 0xffffffff;
  (*_unused->_vptr_Context[0x22])(_unused,0x8d40,0x8ce0,0x8cd2,&local_20);
  checkError((TestContext *)ctx_local,_unused,0x502);
  (*_unused->_vptr_Context[0x22])(_unused,0x8d40,0x8ce0,0x8cd3,&local_20);
  checkError((TestContext *)ctx_local,_unused,0x502);
  return;
}

Assistant:

static void attachmentQueryEmptyFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	static const GLenum attachmentPoints[] =
	{
		GL_COLOR_ATTACHMENT0,
		GL_DEPTH_ATTACHMENT,
		GL_STENCIL_ATTACHMENT
	};

	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(attachmentPoints); ndx++)
		checkFboAttachmentParam(testCtx, ctx, attachmentPoints[ndx], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_NONE);

	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, 0);

	// Check that proper error codes are returned
	GLint unused = -1;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, &unused);
	checkError(testCtx, ctx, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, &unused);
	checkError(testCtx, ctx, GL_INVALID_OPERATION);
}